

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZnode.h
# Opt level: O1

void __thiscall
chrono::ChLoadXYZnodeBodySpring::~ChLoadXYZnodeBodySpring(ChLoadXYZnodeBodySpring *this)

{
  ChLoadCustomMultiple::~ChLoadCustomMultiple((ChLoadCustomMultiple *)this);
  operator_delete(this,0x318);
  return;
}

Assistant:

class ChApi ChLoadXYZnodeBodySpring : public ChLoadXYZnodeBody {
  public:
	  ChLoadXYZnodeBodySpring    (std::shared_ptr<ChNodeXYZ> mnodeA,  ///< node to apply load to
								  std::shared_ptr<ChBody> mbodyB,   ///< node to apply load to as reaction
								  double mK,	///< stiffness,
								  double mR,	///< damping,
								  double mD0=0	///< initial rest length
    );

    /// "Virtual" copy constructor (covariant return type).
    virtual ChLoadXYZnodeBodySpring* Clone() const override { return new ChLoadXYZnodeBodySpring(*this); }

	/// Compute the force on the nodeA, in local coordsystem of SetApplicationFrameB (the 
	/// auxiliary frame attached to body) given relative position of nodeA respect to B
    virtual void ComputeForce(const ChFrameMoving<>& rel_AB,
                               ChVector<>& loc_force) override;

    /// Set stiffness, along direction, es [N/m]
    void SetStiffness(const double mstiffness) { K = mstiffness; }
    double GetStiffness() const { return K; }

    /// Set damping, along direction, es [Ns/m]
    void SetDamping(const double mdamping) { R = mdamping; }
    double GetDamping() const { return R; }

	/// Set initial spring length, es [m]
    void SetRestLength(const double mrest) { d_0 = mrest; }
    double GetRestLength() const { return d_0; }

	/// Use this to enable the stiff force computation (i.e. it enables the
	/// automated computation of the jacobian by numerical differentiation to 
	/// elp the convergence of implicit integrators, but adding CPU overhead).
	void SetStiff(bool ms) { this->is_stiff = ms; }

  protected:
	  double K;
	  double R;
	  double d_0;
	  bool is_stiff;

	  virtual bool IsStiff() override { return is_stiff; }
}